

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemInformation.cxx
# Opt level: O0

string * __thiscall
cmsys::SystemInformationImplementation::ExtractValueFromSysCtl_abi_cxx11_
          (string *__return_storage_ptr__,SystemInformationImplementation *this,char *word)

{
  allocator<char> local_31;
  long local_30;
  size_t pos2;
  size_t pos;
  char *word_local;
  SystemInformationImplementation *this_local;
  
  pos = (size_t)word;
  word_local = (char *)this;
  this_local = (SystemInformationImplementation *)__return_storage_ptr__;
  pos2 = std::__cxx11::string::find((char *)&this->SysCtlBuffer,(ulong)word);
  if (pos2 != 0xffffffffffffffff) {
    pos2 = std::__cxx11::string::find((char *)&this->SysCtlBuffer,0x12664b8);
    local_30 = std::__cxx11::string::find((char)this + -0x20,10);
    if ((pos2 != 0xffffffffffffffff) && (local_30 != -1)) {
      std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)&this->SysCtlBuffer);
      return __return_storage_ptr__;
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,"",&local_31);
  std::allocator<char>::~allocator(&local_31);
  return __return_storage_ptr__;
}

Assistant:

std::string SystemInformationImplementation::ExtractValueFromSysCtl(
  const char* word)
{
  size_t pos = this->SysCtlBuffer.find(word);
  if (pos != std::string::npos) {
    pos = this->SysCtlBuffer.find(": ", pos);
    size_t pos2 = this->SysCtlBuffer.find('\n', pos);
    if (pos != std::string::npos && pos2 != std::string::npos) {
      return this->SysCtlBuffer.substr(pos + 2, pos2 - pos - 2);
    }
  }
  return "";
}